

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall slang::driver::Driver::reportParseDiags(Driver *this)

{
  string_view text;
  bool bVar1;
  int iVar2;
  DiagnosticEngine *this_00;
  iterator diagnostic;
  element_type *peVar3;
  long in_RDI;
  byte bVar4;
  format_args in_stack_00000000;
  string_view in_stack_00000010;
  Diagnostic *diag;
  iterator __end2_2;
  iterator __begin2_2;
  Diagnostics *__range2_2;
  shared_ptr<slang::syntax::SyntaxTree> *tree_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *__range2_1;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  const_iterator __end2;
  const_iterator __begin2;
  SyntaxTreeList *__range2;
  Diagnostics diags;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  SourceManager *in_stack_fffffffffffffda8;
  SmallVectorBase<slang::Diagnostic> *in_stack_fffffffffffffdb0;
  undefined1 local_238 [32];
  char *local_218;
  undefined8 local_210;
  undefined1 local_208 [32];
  __sv_type local_1e8;
  iterator local_1d8;
  iterator local_1d0;
  iterator local_1c8;
  SmallVectorBase<slang::Diagnostic> *local_1c0;
  reference local_1b8;
  shared_ptr<slang::syntax::SyntaxTree> *local_1b0;
  __normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
  local_188 [3];
  SyntaxTreeList *local_170;
  SmallVectorBase<slang::Diagnostic> local_168;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  Diagnostics::Diagnostics((Diagnostics *)0x22d969);
  local_170 = SourceLoader::getLibraryMaps((SourceLoader *)(in_RDI + 0x1030));
  local_188[0]._M_current =
       (shared_ptr<slang::syntax::SyntaxTree> *)
       std::
       vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ::begin(in_stack_fffffffffffffd98);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::end(in_stack_fffffffffffffd98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                      ((__normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (__normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                        *)in_stack_fffffffffffffd98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator*(local_188);
    peVar3 = std::
             __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x22d9f7);
    in_stack_fffffffffffffdb0 =
         (SmallVectorBase<slang::Diagnostic> *)slang::syntax::SyntaxTree::diagnostics(peVar3);
    SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
              (in_stack_fffffffffffffdb0,(Diagnostics *)in_stack_fffffffffffffda8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator++(local_188);
  }
  this_00 = (DiagnosticEngine *)(in_RDI + 0x1190);
  diagnostic = std::
               vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
               ::begin(in_stack_fffffffffffffd98);
  local_1b0 = (shared_ptr<slang::syntax::SyntaxTree> *)
              std::
              vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
              ::end(in_stack_fffffffffffffd98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                      ((__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                       (__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                        *)in_stack_fffffffffffffd98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_1b8 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                ::operator*((__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                             *)&stack0xfffffffffffffe58);
    peVar3 = std::
             __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x22dac0);
    in_stack_fffffffffffffda8 = (SourceManager *)slang::syntax::SyntaxTree::diagnostics(peVar3);
    SmallVectorBase<slang::Diagnostic>::append_range<slang::Diagnostics>
              (in_stack_fffffffffffffdb0,(Diagnostics *)in_stack_fffffffffffffda8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                  *)&stack0xfffffffffffffe58);
  }
  Diagnostics::sort((Diagnostics *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_1c0 = &local_168;
  local_1c8 = SmallVectorBase<slang::Diagnostic>::begin(local_1c0);
  local_1d0 = SmallVectorBase<slang::Diagnostic>::end(local_1c0);
  for (; local_1c8 != local_1d0; local_1c8 = local_1c8 + 1) {
    local_1d8 = local_1c8;
    DiagnosticEngine::issue(this_00,(Diagnostic *)diagnostic._M_current);
  }
  local_218 = "{}";
  local_210 = 2;
  std::__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x22dbc4);
  TextDiagnosticClient::getString_abi_cxx11_((TextDiagnosticClient *)in_stack_fffffffffffffda8);
  local_18 = local_208;
  local_28 = local_218;
  uStack_20 = local_210;
  local_30 = local_238;
  local_48 = local_218;
  uStack_40 = local_210;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            ((value<fmt::v11::context> *)in_stack_fffffffffffffdb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffda8);
  local_8 = &local_58;
  local_10 = local_68;
  local_58 = 0xd;
  local_50 = local_10;
  ::fmt::v11::vformat_abi_cxx11_(in_stack_00000010,in_stack_00000000);
  local_1e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  text._M_str = (char *)in_stack_fffffffffffffdb0;
  text._M_len = (size_t)in_stack_fffffffffffffda8;
  OS::printE(text);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  iVar2 = DiagnosticEngine::getNumErrors((DiagnosticEngine *)(in_RDI + 0xe98));
  bVar4 = iVar2 == 0;
  Diagnostics::~Diagnostics((Diagnostics *)0x22dd0e);
  return (bool)(bVar4 & 1);
}

Assistant:

bool Driver::reportParseDiags() {
    Diagnostics diags;
    for (auto& tree : sourceLoader.getLibraryMaps())
        diags.append_range(tree->diagnostics());
    for (auto& tree : syntaxTrees)
        diags.append_range(tree->diagnostics());

    diags.sort(sourceManager);
    for (auto& diag : diags)
        diagEngine.issue(diag);

    OS::printE(fmt::format("{}", textDiagClient->getString()));
    return diagEngine.getNumErrors() == 0;
}